

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int I2CGetBit(wfRx_t *w)

{
  uint uVar1;
  uint uVar2;
  
  set_SDA(w);
  I2C_delay(w);
  I2C_clock_stretch(w);
  myGpioSetMode((w->field_4).I.SDA,0);
  uVar1 = (w->field_4).I.SDA;
  uVar2 = gpioReg[(ulong)(uVar1 >> 5) + 0xd];
  I2C_delay(w);
  clear_SCL(w);
  return (int)((uVar2 >> (uVar1 & 0x1f) & 1) != 0);
}

Assistant:

static int I2CGetBit(wfRx_t *w)
{
   int bit;

   set_SDA(w); /* let SDA float */
   I2C_delay(w);
   I2C_clock_stretch(w);
   bit = read_SDA(w);
   I2C_delay(w);
   clear_SCL(w);

   return bit;
}